

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifcvn(bifcxdef *ctx,int argc)

{
  char cVar1;
  ushort uVar2;
  runsdef *prVar3;
  runcxdef *ctx_00;
  ushort *puVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  ushort **ppuVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  dattyp typ;
  ulong uVar13;
  char *pcVar14;
  anon_union_8_4_1dda36f5_for_runsv aVar15;
  runsdef val;
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x03') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  puVar4 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar2 = *puVar4;
  if (uVar2 == 6) {
    if (*(int *)(puVar4 + 1) == 0x65757274) {
      typ = 8;
      goto LAB_0020f19d;
    }
  }
  else if ((uVar2 == 5) && (iVar7 = bcmp(puVar4 + 1,"nil",3), iVar7 == 0)) {
    typ = 5;
    goto LAB_0020f19d;
  }
  uVar12 = uVar2 - 2;
  pcVar14 = (char *)((long)puVar4 + (ulong)uVar12 + 2);
  for (lVar11 = 0; bVar5 = true, uVar2 - 2 != (int)lVar11; lVar11 = lVar11 + 1) {
    cVar1 = *(char *)((long)puVar4 + lVar11 + 2);
    if ((long)cVar1 < 0) {
LAB_0020f140:
      pcVar14 = (char *)((long)puVar4 + lVar11 + 2);
      goto LAB_0020f14c;
    }
    ppuVar8 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if (cVar1 != '-') goto LAB_0020f140;
      uVar13 = ((ulong)uVar2 - lVar11) - 3;
      uVar10 = uVar13 & 0xffffffff;
      pcVar6 = (char *)((long)puVar4 + lVar11 + 3);
      goto LAB_0020f116;
    }
    uVar12 = uVar12 - 1;
  }
  uVar12 = 0;
  goto LAB_0020f14c;
  while( true ) {
    if ((long)*pcVar14 < 0) {
      bVar5 = false;
      uVar12 = (uint)uVar13;
      goto LAB_0020f14c;
    }
    uVar12 = uVar12 - 1;
    uVar13 = (ulong)uVar9;
    pcVar6 = pcVar14 + 1;
    if ((*(byte *)((long)*ppuVar8 + (long)*pcVar14 * 2 + 1) & 0x20) == 0) break;
LAB_0020f116:
    pcVar14 = pcVar6;
    iVar7 = (int)uVar10;
    uVar9 = iVar7 - 1;
    uVar10 = (ulong)uVar9;
    if (iVar7 == 0) {
      uVar12 = 0;
      break;
    }
  }
  bVar5 = false;
LAB_0020f14c:
  aVar15.runsvnum = 0;
  for (lVar11 = 0; uVar12 != (uint)lVar11; lVar11 = lVar11 + 1) {
    ppuVar8 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar8 + (ulong)(byte)pcVar14[lVar11] * 2 + 1) & 8) == 0) break;
    aVar15.runsvstr = (uchar *)(aVar15.runsvnum * 10 + (ulong)(byte)pcVar14[lVar11] + -0x30);
  }
  val.runsv.runsvnum = -aVar15.runsvnum;
  if (bVar5) {
    val.runsv = aVar15;
  }
  typ = 1;
LAB_0020f19d:
  runpush(ctx_00,typ,&val);
  return;
}

Assistant:

void bifcvn(bifcxdef *ctx, int argc)
{
    runsdef  val;
    uchar   *p;
    int      len;
    int      typ;
    long     acc;
    int      neg;
    
    bifcntargs(ctx, 1, argc);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    if (len == 3 && !memcmp(p, "nil", (size_t)3))
        typ = DAT_NIL;
    else if (len == 4 && !memcmp(p, "true", (size_t)4))
        typ = DAT_TRUE;
    else
    {
        typ = DAT_NUMBER;
        for ( ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        if (len != 0 && *p == '-')
        {
            neg = TRUE;
            for (++p, --len ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        }
        else neg = FALSE;

        /* accumulate the number digit by digit */
        for (acc = 0 ; len != 0 && isdigit(*p) ; ++p, --len)
            acc = (acc << 3) + (acc << 1) + ((*p) - '0');

        if (neg) acc = -acc;
        val.runsv.runsvnum = acc;
    }
    
    runpush(ctx->bifcxrun, typ, &val);
}